

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ModportClockingSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::ModportClockingSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
          (BumpAllocator *this,basic_string_view<char,_std::char_traits<char>_> *args,
          SourceLocation *args_1)

{
  SourceLocation SVar1;
  size_t sVar2;
  char *pcVar3;
  ModportClockingSymbol *pMVar4;
  
  pMVar4 = (ModportClockingSymbol *)allocate(this,0x48,8);
  sVar2 = args->_M_len;
  pcVar3 = args->_M_str;
  SVar1 = *args_1;
  (pMVar4->super_Symbol).kind = ModportClocking;
  (pMVar4->super_Symbol).name._M_len = sVar2;
  (pMVar4->super_Symbol).name._M_str = pcVar3;
  (pMVar4->super_Symbol).location = SVar1;
  (pMVar4->super_Symbol).indexInScope = 0;
  (pMVar4->super_Symbol).parentScope = (Scope *)0x0;
  (pMVar4->super_Symbol).nextInScope = (Symbol *)0x0;
  (pMVar4->super_Symbol).originatingSyntax = (SyntaxNode *)0x0;
  pMVar4->target = (Symbol *)0x0;
  return pMVar4;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }